

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_function_queue.h
# Opt level: O3

optional<int> __thiscall
density::
lf_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::try_consume_impl(lf_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *this,LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
                         *param_2)

{
  int iVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_int_()> *pFVar2;
  void *pvVar3;
  Consume local_38;
  
  local_38.m_queue =
       (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
        *)0x0;
  local_38.m_control = (ControlBlock *)0x0;
  local_38.m_next_ptr = 0;
  detail::
  LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  ::Consume::start_consume_impl(&local_38,param_2);
  if (local_38.m_next_ptr < 0x10) {
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    .m_tail.super___atomic_base<unsigned_long>._M_i = 0;
  }
  else {
    pFVar2 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::complete_type((consume_operation *)&local_38);
    pvVar3 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::unaligned_element_ptr((consume_operation *)&local_38);
    iVar1 = (*pFVar2->m_align_invoke_destroy)(pvVar3);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::commit_nodestroy((consume_operation *)&local_38);
    *(undefined1 *)
     ((long)&(this->m_queue).
             super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
             .
             super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
             .m_tail.super___atomic_base<unsigned_long>._M_i + 4) = 1;
    *(int *)&(this->m_queue).
             super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
             .
             super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
             .m_tail.super___atomic_base<unsigned_long>._M_i = iVar1;
    if (0xf < local_38.m_next_ptr) {
      LOCK();
      (local_38.m_control)->m_next = local_38.m_next_ptr - 2;
      UNLOCK();
    }
  }
  return (optional<int>)this;
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }